

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSubsetHB.c
# Opt level: O3

DdNode * cuddSubsetHeavyBranch(DdManager *dd,DdNode *f,int numVars,int threshold)

{
  int *piVar1;
  double **ppdVar2;
  int iVar3;
  int iVar4;
  st__table *table;
  NodeData_t **ppNVar5;
  NodeData_t *__ptr;
  NodeData_t **ppNVar6;
  NodeData_t *pNVar7;
  int **ppiVar8;
  int **__ptr_00;
  int *piVar9;
  st__table *table_00;
  DdNode *pDVar10;
  st__table *approxTable;
  st__generator *psVar11;
  int ***pppiVar12;
  long lVar13;
  long lVar14;
  NodeData_t ***pppNVar15;
  ulong uVar16;
  char *value;
  char *key;
  NodeData_t *currNodeQual;
  DdNode *local_50;
  DdNode *local_48;
  int *local_40;
  char *local_38;
  
  if (f == (DdNode *)0x0) {
    fwrite("Cannot subset, nil object\n",0x1a,1,(FILE *)dd->err);
    dd->errorCode = CUDD_INVALID_ARG;
    return (DdNode *)0x0;
  }
  one = Cudd_ReadOne(dd);
  zero = (DdNode *)((ulong)one ^ 1);
  iVar3 = 0x3ff;
  if (numVars != 0) {
    iVar3 = numVars;
  }
  if (*(int *)((ulong)f & 0xfffffffffffffffe) == 0x7fffffff) {
    return f;
  }
  max = ldexp(1.0,iVar3);
  max = ldexp(1.0,iVar3);
  table = st__init_table(st__ptrcmp,st__ptrhash);
  if (table == (st__table *)0x0) goto LAB_007e96f2;
  maxPages = 0x80;
  ppNVar5 = (NodeData_t **)malloc(0x400);
  mintermPages = (double **)ppNVar5;
  if (ppNVar5 == (NodeData_t **)0x0) {
LAB_007e96ea:
    st__free_table(table);
  }
  else {
    page = 0;
    __ptr = (NodeData_t *)malloc(0x4000);
    currentMintermPage = (double *)__ptr;
    *ppNVar5 = __ptr;
    if (__ptr == (NodeData_t *)0x0) {
LAB_007e96d4:
      pppNVar15 = (NodeData_t ***)&mintermPages;
LAB_007e96db:
      free(ppNVar5);
      *pppNVar15 = (NodeData_t **)0x0;
      goto LAB_007e96ea;
    }
    pageIndex = 0;
    maxNodeDataPages = 0x80;
    ppNVar6 = (NodeData_t **)malloc(0x400);
    nodeDataPages = ppNVar6;
    if (ppNVar6 == (NodeData_t **)0x0) {
      free(__ptr);
      goto LAB_007e96d4;
    }
    nodeDataPage = 0;
    pNVar7 = (NodeData_t *)malloc(0x6000);
    currentNodeDataPage = pNVar7;
    *ppNVar6 = pNVar7;
    if (pNVar7 == (NodeData_t *)0x0) {
      free(__ptr);
      free(ppNVar5);
      mintermPages = (double **)0x0;
      pppNVar15 = &nodeDataPages;
      ppNVar5 = ppNVar6;
      goto LAB_007e96db;
    }
    nodeDataPageIndex = 0;
    SubsetCountMintermAux(f,max,table);
    if (memOut == '\0') {
      max = ldexp(1.0,iVar3);
      maxPages = 0x80;
      local_40 = (int *)max;
      ppiVar8 = (int **)malloc(0x400);
      nodePages = ppiVar8;
      if (ppiVar8 != (int **)0x0) {
        __ptr_00 = (int **)malloc(0x400);
        ppdVar2 = mintermPages;
        lightNodePages = __ptr_00;
        if (__ptr_00 == (int **)0x0) {
          uVar16 = (ulong)(uint)page;
          if (page < 0) {
            if (mintermPages != (double **)0x0) goto LAB_007e987b;
          }
          else {
            lVar13 = 0;
            do {
              if (ppdVar2[lVar13] != (double *)0x0) {
                free(ppdVar2[lVar13]);
                ppdVar2[lVar13] = (double *)0x0;
              }
              lVar13 = lVar13 + 1;
            } while (uVar16 + 1 != lVar13);
LAB_007e987b:
            free(ppdVar2);
            mintermPages = (double **)0x0;
          }
          ppNVar5 = nodeDataPages;
          uVar16 = (ulong)(uint)nodeDataPage;
          if (-1 < nodeDataPage) {
            lVar13 = 0;
            do {
              if (ppNVar5[lVar13] != (NodeData_t *)0x0) {
                free(ppNVar5[lVar13]);
                ppNVar5[lVar13] = (NodeData_t *)0x0;
              }
              lVar13 = lVar13 + 1;
            } while (uVar16 + 1 != lVar13);
LAB_007e98d0:
            free(ppNVar5);
            pppiVar12 = (int ***)&nodeDataPages;
            goto LAB_007e9949;
          }
          if (nodeDataPages != (NodeData_t **)0x0) goto LAB_007e98d0;
        }
        else {
          page = 0;
          piVar9 = (int *)malloc(0x2000);
          *ppiVar8 = piVar9;
          ppdVar2 = mintermPages;
          currentNodePage = piVar9;
          if (piVar9 == (int *)0x0) {
            if (*mintermPages != (double *)0x0) {
              free(*mintermPages);
            }
            free(ppdVar2);
            ppNVar5 = nodeDataPages;
            mintermPages = (double **)0x0;
            uVar16 = (ulong)(uint)nodeDataPage;
            if (nodeDataPage < 0) {
              if (nodeDataPages != (NodeData_t **)0x0) goto LAB_007e98e6;
            }
            else {
              lVar13 = 0;
              do {
                if (ppNVar5[lVar13] != (NodeData_t *)0x0) {
                  free(ppNVar5[lVar13]);
                  ppNVar5[lVar13] = (NodeData_t *)0x0;
                }
                lVar13 = lVar13 + 1;
              } while (uVar16 + 1 != lVar13);
LAB_007e98e6:
              free(ppNVar5);
              nodeDataPages = (NodeData_t **)0x0;
            }
            free(__ptr_00);
            pppiVar12 = &lightNodePages;
          }
          else {
            currentLightNodePage = (int *)malloc(0x2000);
            *__ptr_00 = currentLightNodePage;
            ppdVar2 = mintermPages;
            if (currentLightNodePage != (int *)0x0) {
              pageIndex = 0;
              iVar3 = SubsetCountNodesAux(f,table,(double)local_40);
              if (memOut != '\0') goto LAB_007e96f2;
              iVar4 = st__lookup(table,(char *)f,&local_38);
              if (iVar4 == 0) {
                fwrite("Something is wrong, ought to be node quality table\n",0x33,1,(FILE *)dd->err
                      );
                dd->errorCode = CUDD_INTERNAL_ERROR;
              }
              piVar9 = (int *)malloc(4);
              if (piVar9 == (int *)0x0) goto LAB_007e9716;
              *piVar9 = iVar3;
              table_00 = st__init_table(st__ptrcmp,st__ptrhash);
              piVar1 = (int *)(((ulong)one & 0xfffffffffffffffe) + 4);
              *piVar1 = *piVar1 + 1;
              pDVar10 = Cudd_ReadOne(dd);
              iVar3 = st__insert(table_00,(char *)pDVar10,(char *)0x0);
              if (iVar3 == -10000) {
                fwrite("Something wrong, st__table insert failed\n",0x29,1,(FILE *)dd->out);
              }
              approxTable = st__init_table(st__ptrcmp,st__ptrhash);
              pDVar10 = BuildSubsetBdd(dd,f,piVar9,table,threshold,table_00,approxTable);
              if (pDVar10 != (DdNode *)0x0) {
                piVar1 = (int *)(((ulong)pDVar10 & 0xfffffffffffffffe) + 4);
                *piVar1 = *piVar1 + 1;
              }
              psVar11 = st__init_gen(approxTable);
              if (psVar11 == (st__generator *)0x0) {
LAB_007e9970:
                st__free_table(approxTable);
                return (DdNode *)0x0;
              }
              local_40 = piVar9;
              iVar3 = st__gen(psVar11,(char **)&local_48,(char **)&local_50);
              if (iVar3 != 0) {
                do {
                  Cudd_RecursiveDeref(dd,local_50);
                  iVar3 = st__gen(psVar11,(char **)&local_48,(char **)&local_50);
                } while (iVar3 != 0);
              }
              st__free_gen(psVar11);
              st__free_table(approxTable);
              psVar11 = st__init_gen(table_00);
              approxTable = table_00;
              if (psVar11 == (st__generator *)0x0) goto LAB_007e9970;
              iVar3 = st__gen(psVar11,(char **)&local_48,(char **)&local_50);
              if (iVar3 != 0) {
                do {
                  Cudd_RecursiveDeref(dd,local_48);
                  iVar3 = st__gen(psVar11,(char **)&local_48,(char **)&local_50);
                } while (iVar3 != 0);
              }
              st__free_gen(psVar11);
              st__free_table(table_00);
              ppdVar2 = mintermPages;
              iVar3 = page;
              if (page < 0) {
                if (mintermPages != (double **)0x0) {
                  free(mintermPages);
                  mintermPages = (double **)0x0;
                }
LAB_007e9999:
                if (nodePages != (int **)0x0) {
                  free(nodePages);
                  nodePages = (int **)0x0;
                }
LAB_007e99bd:
                ppiVar8 = lightNodePages;
                if (lightNodePages != (int **)0x0) goto LAB_007e99c2;
              }
              else {
                lVar13 = (ulong)(uint)page + 1;
                lVar14 = 0;
                do {
                  if (ppdVar2[lVar14] != (double *)0x0) {
                    free(ppdVar2[lVar14]);
                    ppdVar2[lVar14] = (double *)0x0;
                  }
                  lVar14 = lVar14 + 1;
                } while (lVar13 != lVar14);
                free(ppdVar2);
                ppiVar8 = nodePages;
                mintermPages = (double **)0x0;
                if (iVar3 < 0) goto LAB_007e9999;
                lVar14 = 0;
                do {
                  if (ppiVar8[lVar14] != (int *)0x0) {
                    free(ppiVar8[lVar14]);
                    ppiVar8[lVar14] = (int *)0x0;
                  }
                  lVar14 = lVar14 + 1;
                } while (lVar13 != lVar14);
                free(ppiVar8);
                ppiVar8 = lightNodePages;
                nodePages = (int **)0x0;
                if (iVar3 < 0) goto LAB_007e99bd;
                lVar14 = 0;
                do {
                  if (ppiVar8[lVar14] != (int *)0x0) {
                    free(ppiVar8[lVar14]);
                    ppiVar8[lVar14] = (int *)0x0;
                  }
                  lVar14 = lVar14 + 1;
                } while (lVar13 != lVar14);
LAB_007e99c2:
                free(ppiVar8);
                lightNodePages = (int **)0x0;
              }
              ppNVar5 = nodeDataPages;
              uVar16 = (ulong)(uint)nodeDataPage;
              if (nodeDataPage < 0) {
                if (nodeDataPages == (NodeData_t **)0x0) goto LAB_007e9a26;
              }
              else {
                lVar13 = 0;
                do {
                  if (ppNVar5[lVar13] != (NodeData_t *)0x0) {
                    free(ppNVar5[lVar13]);
                    ppNVar5[lVar13] = (NodeData_t *)0x0;
                  }
                  lVar13 = lVar13 + 1;
                } while (uVar16 + 1 != lVar13);
              }
              free(ppNVar5);
              nodeDataPages = (NodeData_t **)0x0;
LAB_007e9a26:
              st__free_table(table);
              free(local_40);
              if (pDVar10 == (DdNode *)0x0) {
                return (DdNode *)0x0;
              }
              piVar9 = (int *)(((ulong)pDVar10 & 0xfffffffffffffffe) + 4);
              *piVar9 = *piVar9 + -1;
              return pDVar10;
            }
            if (*mintermPages != (double *)0x0) {
              free(*mintermPages);
            }
            free(ppdVar2);
            ppNVar5 = nodeDataPages;
            mintermPages = (double **)0x0;
            uVar16 = (ulong)(uint)nodeDataPage;
            if (nodeDataPage < 0) {
              if (nodeDataPages != (NodeData_t **)0x0) goto LAB_007e990f;
            }
            else {
              lVar13 = 0;
              do {
                if (ppNVar5[lVar13] != (NodeData_t *)0x0) {
                  free(ppNVar5[lVar13]);
                  ppNVar5[lVar13] = (NodeData_t *)0x0;
                }
                lVar13 = lVar13 + 1;
              } while (uVar16 + 1 != lVar13);
LAB_007e990f:
              free(ppNVar5);
              nodeDataPages = (NodeData_t **)0x0;
            }
            free(piVar9);
            currentNodePage = (int *)0x0;
            free(__ptr_00);
            pppiVar12 = &lightNodePages;
          }
LAB_007e9949:
          *pppiVar12 = (int **)0x0;
        }
        free(ppiVar8);
        nodePages = (int **)0x0;
      }
    }
  }
LAB_007e96f2:
  memOut = '\x01';
  fwrite("Out-of-memory; Cannot subset\n",0x1d,1,(FILE *)dd->err);
LAB_007e9716:
  dd->errorCode = CUDD_MEMORY_OUT;
  return (DdNode *)0x0;
}

Assistant:

DdNode *
cuddSubsetHeavyBranch(
  DdManager * dd /* DD manager */,
  DdNode * f /* current DD */,
  int  numVars /* maximum number of variables */,
  int  threshold /* threshold size for the subset */)
{

    int i, *size;
    st__table *visitedTable;
    int numNodes;
    NodeData_t *currNodeQual;
    DdNode *subset;
    st__table *storeTable, *approxTable;
    char *key, *value;
    st__generator *stGen;

    if (f == NULL) {
        fprintf(dd->err, "Cannot subset, nil object\n");
        dd->errorCode = CUDD_INVALID_ARG;
        return(NULL);
    }

    one  = Cudd_ReadOne(dd);
    zero = Cudd_Not(one);

    /* If user does not know numVars value, set it to the maximum
     * exponent that the pow function can take. The -1 is due to the
     * discrepancy in the value that pow takes and the value that
     * log gives.
     */
    if (numVars == 0) {
        /* set default value */
        numVars = DBL_MAX_EXP - 1;
    }

    if (Cudd_IsConstant(f)) {
        return(f);
    }

    max = pow(2.0, (double)numVars);

    /* Create visited table where structures for node data are allocated and
       stored in a st__table */
    visitedTable = SubsetCountMinterm(f, numVars);
    if ((visitedTable == NULL) || memOut) {
        (void) fprintf(dd->err, "Out-of-memory; Cannot subset\n");
        dd->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    numNodes = SubsetCountNodes(f, visitedTable, numVars);
    if (memOut) {
        (void) fprintf(dd->err, "Out-of-memory; Cannot subset\n");
        dd->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }

    if ( st__lookup(visitedTable, (const char *)f, (char **)&currNodeQual) == 0) {
        fprintf(dd->err,
                "Something is wrong, ought to be node quality table\n");
        dd->errorCode = CUDD_INTERNAL_ERROR;
    }

    size = ABC_ALLOC(int, 1);
    if (size == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    *size = numNodes;

#ifdef DEBUG
    num_calls = 0;
#endif
    /* table to store nodes being created. */
    storeTable = st__init_table( st__ptrcmp, st__ptrhash);
    /* insert the constant */
    cuddRef(one);
    if ( st__insert(storeTable, (char *)Cudd_ReadOne(dd), NIL(char)) ==
        st__OUT_OF_MEM) {
        fprintf(dd->out, "Something wrong, st__table insert failed\n");
    }
    /* table to store approximations of nodes */
    approxTable = st__init_table( st__ptrcmp, st__ptrhash);
    subset = (DdNode *)BuildSubsetBdd(dd, f, size, visitedTable, threshold,
                                      storeTable, approxTable);
    if (subset != NULL) {
        cuddRef(subset);
    }

    stGen = st__init_gen(approxTable);
    if (stGen == NULL) {
        st__free_table(approxTable);
        return(NULL);
    }
    while( st__gen(stGen, (const char **)&key, (char **)&value)) {
        Cudd_RecursiveDeref(dd, (DdNode *)value);
    }
    st__free_gen(stGen); stGen = NULL;
    st__free_table(approxTable);

    stGen = st__init_gen(storeTable);
    if (stGen == NULL) {
        st__free_table(storeTable);
        return(NULL);
    }
    while( st__gen(stGen, (const char **)&key, (char **)&value)) {
        Cudd_RecursiveDeref(dd, (DdNode *)key);
    }
    st__free_gen(stGen); stGen = NULL;
    st__free_table(storeTable);

    for (i = 0; i <= page; i++) {
        ABC_FREE(mintermPages[i]);
    }
    ABC_FREE(mintermPages);
    for (i = 0; i <= page; i++) {
        ABC_FREE(nodePages[i]);
    }
    ABC_FREE(nodePages);
    for (i = 0; i <= page; i++) {
        ABC_FREE(lightNodePages[i]);
    }
    ABC_FREE(lightNodePages);
    for (i = 0; i <= nodeDataPage; i++) {
        ABC_FREE(nodeDataPages[i]);
    }
    ABC_FREE(nodeDataPages);
    st__free_table(visitedTable);
    ABC_FREE(size);
#if 0
    (void) Cudd_DebugCheck(dd);
    (void) Cudd_CheckKeys(dd);
#endif

    if (subset != NULL) {
#ifdef DD_DEBUG
      if (!Cudd_bddLeq(dd, subset, f)) {
            fprintf(dd->err, "Wrong subset\n");
            dd->errorCode = CUDD_INTERNAL_ERROR;
            return(NULL);
      }
#endif
        cuddDeref(subset);
        return(subset);
    } else {
        return(NULL);
    }
}